

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Container<google::protobuf::UnknownFieldSet> *
google::protobuf::Arena::
CreateArenaCompatible<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
          (Arena *arena)

{
  Container<google::protobuf::UnknownFieldSet> *pCVar1;
  
  if (arena != (Arena *)0x0) {
    pCVar1 = DoCreateMessage<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                       (arena);
    return pCVar1;
  }
  pCVar1 = (Container<google::protobuf::UnknownFieldSet> *)operator_new(0x18);
  internal::ShortSooRep::ShortSooRep((ShortSooRep *)&pCVar1->unknown_fields,(Arena *)0x0);
  return pCVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* PROTOBUF_NONNULL
  CreateArenaCompatible(Arena* PROTOBUF_NULLABLE arena) {
    static_assert(is_arena_constructable<T>::value,
                  "Can only construct types that are ArenaConstructable");
    if (ABSL_PREDICT_FALSE(arena == nullptr)) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }